

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

_Bool bitset_container_validate(bitset_container_t *v,char **reason)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  
  if (v->words == (uint64_t *)0x0) {
    pcVar3 = "words is NULL";
  }
  else {
    iVar1 = v->cardinality;
    iVar2 = bitset_container_compute_cardinality(v);
    if (iVar1 == iVar2) {
      if (0x1000 < v->cardinality) {
        return true;
      }
      pcVar3 = "cardinality is too small for a bitmap container";
    }
    else {
      pcVar3 = "cardinality is incorrect";
    }
  }
  *reason = pcVar3;
  return false;
}

Assistant:

bool bitset_container_validate(const bitset_container_t *v, const char **reason) {
    if (v->words == NULL) {
        *reason = "words is NULL";
        return false;
    }
    if (v->cardinality != bitset_container_compute_cardinality(v)) {
        *reason = "cardinality is incorrect";
        return false;
    }
    if (v->cardinality <= DEFAULT_MAX_SIZE) {
        *reason = "cardinality is too small for a bitmap container";
        return false;
    }
    // Attempt to forcibly load the first and last words, hopefully causing
    // a segfault or an address sanitizer error if words is not allocated.
    volatile uint64_t *words = v->words;
    (void) words[0];
    (void) words[BITSET_CONTAINER_SIZE_IN_WORDS - 1];
    return true;
}